

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_tiles.cpp
# Opt level: O0

void __thiscall CLayerTiles::PrepareForSave(CLayerTiles *this)

{
  undefined4 uVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [2];
  CEditorImage **ppCVar5;
  ulong uVar6;
  void *pvVar7;
  long lVar8;
  long in_RDI;
  long in_FS_OFFSET;
  int i_1;
  int NumWrittenSaveTiles;
  int i;
  int NumHitMaxSkip;
  int NumSaveTiles;
  int x_1;
  int y_1;
  int x;
  int y;
  CTile Tile;
  int local_3c;
  int local_38;
  int local_34;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  undefined1 local_c [2];
  char cStack_a;
  undefined1 uStack_9;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  for (local_1c = 0; local_1c < *(int *)(in_RDI + 0x38); local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < *(int *)(in_RDI + 0x34); local_20 = local_20 + 1) {
      lVar8 = (long)(local_1c * *(int *)(in_RDI + 0x34) + local_20);
      *(byte *)(*(long *)(in_RDI + 0x68) + 1 + lVar8 * 4) =
           *(byte *)(*(long *)(in_RDI + 0x68) + 1 + lVar8 * 4) & 0xb;
      if (*(char *)(*(long *)(in_RDI + 0x68) +
                   (long)(local_1c * *(int *)(in_RDI + 0x34) + local_20) * 4) == '\0') {
        *(undefined1 *)
         (*(long *)(in_RDI + 0x68) + 1 + (long)(local_1c * *(int *)(in_RDI + 0x34) + local_20) * 4)
             = 0;
      }
    }
  }
  if ((*(int *)(in_RDI + 0x30) != -1) && (*(int *)(in_RDI + 0x48) == 0xff)) {
    for (local_24 = 0; local_24 < *(int *)(in_RDI + 0x38); local_24 = local_24 + 1) {
      for (local_28 = 0; local_28 < *(int *)(in_RDI + 0x34); local_28 = local_28 + 1) {
        ppCVar5 = array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::operator[]
                            ((array<CEditorImage_*,_allocator_default<CEditorImage_*>_> *)
                             (*(long *)(in_RDI + 8) + 0x1260),*(int *)(in_RDI + 0x30));
        lVar8 = (long)(local_24 * *(int *)(in_RDI + 0x34) + local_28);
        *(byte *)(*(long *)(in_RDI + 0x68) + 1 + lVar8 * 4) =
             *(byte *)(*(long *)(in_RDI + 0x68) + 1 + lVar8 * 4) |
             (*ppCVar5)->m_aTileFlags
             [*(byte *)(*(long *)(in_RDI + 0x68) +
                       (long)(local_24 * *(int *)(in_RDI + 0x34) + local_28) * 4)];
      }
    }
  }
  local_2c = 0;
  _local_c = CONCAT12(0xff,local_c);
  local_34 = 0;
  while( true ) {
    auVar4 = local_c;
    if (*(int *)(in_RDI + 0x34) * *(int *)(in_RDI + 0x38) <= local_34) break;
    if (cStack_a == -1) {
      uVar1 = *(undefined4 *)(*(long *)(in_RDI + 0x68) + (long)local_34 * 4);
      uStack_9 = (undefined1)((uint)uVar1 >> 0x18);
      local_c = SUB42(uVar1,0);
      _local_c = (uint3)(ushort)local_c;
      local_2c = local_2c + 1;
    }
    else if ((*(char *)(*(long *)(in_RDI + 0x68) + (long)local_34 * 4) == local_c[0]) &&
            (*(char *)(*(long *)(in_RDI + 0x68) + 1 + (long)local_34 * 4) == local_c[1])) {
      _local_c = CONCAT12(cStack_a + '\x01',auVar4);
    }
    else {
      uVar1 = *(undefined4 *)(*(long *)(in_RDI + 0x68) + (long)local_34 * 4);
      uStack_9 = (undefined1)((uint)uVar1 >> 0x18);
      local_c = SUB42(uVar1,0);
      _local_c = (uint3)(ushort)local_c;
      local_2c = local_2c + 1;
    }
    local_34 = local_34 + 1;
  }
  if ((*(long *)(in_RDI + 0x58) != 0) && (*(void **)(in_RDI + 0x58) != (void *)0x0)) {
    operator_delete__(*(void **)(in_RDI + 0x58));
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)local_2c;
  uVar6 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  pvVar7 = operator_new__(uVar6);
  *(void **)(in_RDI + 0x58) = pvVar7;
  *(int *)(in_RDI + 0x60) = local_2c << 2;
  local_38 = 0;
  _local_c = CONCAT12(0xff,local_c);
  for (local_3c = 0; local_3c < *(int *)(in_RDI + 0x34) * *(int *)(in_RDI + 0x38) + 1;
      local_3c = local_3c + 1) {
    if ((((local_3c == *(int *)(in_RDI + 0x34) * *(int *)(in_RDI + 0x38)) || (cStack_a == -1)) ||
        (*(char *)(*(long *)(in_RDI + 0x68) + (long)local_3c * 4) != local_c[0])) ||
       (*(char *)(*(long *)(in_RDI + 0x68) + 1 + (long)local_3c * 4) != local_c[1])) {
      if (local_3c != 0) {
        *(undefined4 *)(*(long *)(in_RDI + 0x58) + (long)local_38 * 4) = _local_c;
        local_38 = local_38 + 1;
      }
      if (local_3c != *(int *)(in_RDI + 0x34) * *(int *)(in_RDI + 0x38)) {
        uVar1 = *(undefined4 *)(*(long *)(in_RDI + 0x68) + (long)local_3c * 4);
        uStack_9 = (undefined1)((uint)uVar1 >> 0x18);
        local_c = SUB42(uVar1,0);
        _local_c = (uint3)(ushort)local_c;
      }
    }
    else {
      _local_c = CONCAT12(cStack_a + '\x01',local_c);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CLayerTiles::PrepareForSave()
{
	for(int y = 0; y < m_Height; y++)
		for(int x = 0; x < m_Width; x++)
		{
			m_pTiles[y*m_Width+x].m_Flags &= TILEFLAG_VFLIP|TILEFLAG_HFLIP|TILEFLAG_ROTATE;
			if(m_pTiles[y*m_Width+x].m_Index == 0)
				m_pTiles[y*m_Width+x].m_Flags = 0;
		}

	if(m_Image != -1 && m_Color.a == 255)
	{
		for(int y = 0; y < m_Height; y++)
			for(int x = 0; x < m_Width; x++)
				m_pTiles[y*m_Width+x].m_Flags |= m_pEditor->m_Map.m_lImages[m_Image]->m_aTileFlags[m_pTiles[y*m_Width+x].m_Index];
	}

	int NumSaveTiles = 0; // number of unique tiles that we have to save
	CTile Tile; // current tile to be duplicated
	Tile.m_Skip = MAX_SKIP; // tell the code that we can't skip the first tile

	int NumHitMaxSkip = -1;

	for(int i = 0; i < m_Width * m_Height; i++)
	{
		// we can only store MAX_SKIP empty tiles in one tile
		if(Tile.m_Skip == MAX_SKIP)
		{
			Tile = m_pTiles[i];
			Tile.m_Skip = 0;
			NumSaveTiles++;
			NumHitMaxSkip++;
		}
		// tile is different from last one? - can't skip it
		else if(m_pTiles[i].m_Index != Tile.m_Index || m_pTiles[i].m_Flags != Tile.m_Flags)
		{
			Tile = m_pTiles[i];
			Tile.m_Skip = 0;
			NumSaveTiles++;
		}
		// if the tile is the same as the previous one - no need to
		// save it separately
		else
			Tile.m_Skip++;
	}

	if(m_pSaveTiles)
		delete [] m_pSaveTiles;

	m_pSaveTiles = new CTile[NumSaveTiles];
	m_SaveTilesSize = sizeof(CTile) * NumSaveTiles;

	int NumWrittenSaveTiles = 0;
	Tile.m_Skip = MAX_SKIP;
	for(int i = 0; i < m_Width * m_Height + 1; i++)
	{
		// again, if an tile is the same as the previous one
		// and we have place to store it, skip it!
		// if we are at the end of the layer, write one more tile
		if(i != m_Width * m_Height && Tile.m_Skip != MAX_SKIP && m_pTiles[i].m_Index == Tile.m_Index && m_pTiles[i].m_Flags == Tile.m_Flags)
		{
			Tile.m_Skip++;
		}
		// tile is not skippable
		else
		{
			// if this is not the first tile, we have to save the previous
			// tile beforehand
			if(i != 0)
				m_pSaveTiles[NumWrittenSaveTiles++] = Tile;

			// if this isn't the last tile, store it so we can check how
			// many tiles to skip
			if(i != m_Width * m_Height)
			{
				Tile = m_pTiles[i];
				Tile.m_Skip = 0;
			}
		}
	}
}